

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::logObj
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  _Ios_Openmode _Var1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar3;
  Timer *this_00;
  long *in_RDI;
  double dVar4;
  ofstream file;
  stringstream stream;
  Timer *in_stack_fffffffffffffbd0;
  string local_3e0 [32];
  string local_3c0 [32];
  ostream local_3a0 [528];
  stringstream local_190 [16];
  undefined1 local_180 [384];
  
  levinkov::Timer::stop(in_stack_fffffffffffffbd0);
  std::__cxx11::stringstream::stringstream(local_190);
  dVar4 = levinkov::Timer::get_elapsed_seconds((Timer *)(*in_RDI + 0x60));
  poVar2 = (ostream *)std::ostream::operator<<(local_180,dVar4);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"inf");
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(__lhs,(double)in_RDI[0x14]);
  poVar3 = std::operator<<(poVar2," ");
  poVar3 = std::operator<<(poVar3,"nan");
  poVar3 = std::operator<<(poVar3," 0 0 0");
  this_00 = (Timer *)std::operator<<(poVar3," 0 0 0");
  std::operator<<((ostream *)this_00," 0 0\n");
  std::operator+(__lhs,(char *)poVar2);
  _Var1 = std::operator|(_S_out,_S_app);
  std::ofstream::ofstream(local_3a0,local_3c0,_Var1);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::stringstream::str();
  std::operator<<(local_3a0,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::ofstream::close();
  std::ofstream::~ofstream(local_3a0);
  levinkov::Timer::start(this_00);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

inline void logObj()
    {
        data_.timer.stop();

        std::stringstream stream;
        stream << data_.timer.get_elapsed_seconds() << " "
               << "inf" // bound
               << " " << objective_ << " "
               << "nan"    // gap
               << " 0 0 0" // violated constraints;
               << " 0 0 0" // termination/birth/bifuraction constr.
               << " 0 0\n";

        {
            std::ofstream file(data_.solutionName + "-optimization-log.txt",
                               std::ofstream::out | std::ofstream::app);
            file << stream.str();
            file.close();
        }

        data_.timer.start();
    }